

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_nodes
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_data *out_data)

{
  int iVar1;
  uint i_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cgltf_extension *__s;
  ulong uVar6;
  cgltf_float *out_array;
  cgltf_size *out_array_00;
  jsmntok_t *pjVar7;
  cgltf_size cVar8;
  cgltf_node *out_string;
  cgltf_size cVar9;
  cgltf_size *in_stack_ffffffffffffff38;
  int local_ac;
  ulong local_a0;
  
  out_array_00 = &out_data->nodes_count;
  i_00 = cgltf_parse_json_array
                   (options,tokens,i,(uint8_t *)0xf0,(size_t)&out_data->nodes,(void **)out_array_00,
                    in_stack_ffffffffffffff38);
  if ((-1 < (int)i_00) && (uVar6 = *out_array_00, uVar6 != 0)) {
    local_a0 = 0;
    while (tokens[i_00].type == JSMN_OBJECT) {
      out_string = out_data->nodes + local_a0;
      *(undefined8 *)(out_string->rotation + 3) = 0x3f8000003f800000;
      out_string->scale[1] = 1.0;
      out_string->scale[2] = 1.0;
      out_string->matrix[0] = 1.0;
      out_string->matrix[5] = 1.0;
      out_string->matrix[10] = 1.0;
      out_string->matrix[0xf] = 1.0;
      iVar1 = tokens[i_00].size;
      i_00 = i_00 + 1;
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          if ((tokens[i_00].type != JSMN_STRING) || (pjVar7 = tokens + i_00, pjVar7->size == 0))
          goto LAB_00111e1a;
          iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"name");
          if (iVar2 == 0) {
            i_00 = cgltf_parse_json_string(options,tokens,i_00 + 1,json_chunk,&out_string->name);
LAB_00111a81:
            if ((int)i_00 < 0) {
              return i_00;
            }
          }
          else {
            iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"children");
            if (iVar2 == 0) {
              i_00 = cgltf_parse_json_array
                               (options,tokens,i_00 + 1,(uint8_t *)0x8,(size_t)&out_string->children
                                ,(void **)&out_string->children_count,in_stack_ffffffffffffff38);
              if ((int)i_00 < 0) {
                return i_00;
              }
              cVar8 = out_string->children_count;
              if (cVar8 != 0) {
                pjVar7 = tokens + i_00;
                cVar9 = 0;
                do {
                  iVar2 = cgltf_json_to_int(pjVar7,json_chunk);
                  out_string->children[cVar9] = (cgltf_node *)((long)iVar2 + 1);
                  cVar9 = cVar9 + 1;
                  pjVar7 = pjVar7 + 1;
                } while (cVar8 != cVar9);
                i_00 = i_00 + (int)cVar9;
                goto LAB_00111a81;
              }
            }
            else {
              iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"mesh");
              if (iVar2 == 0) {
                if (tokens[(ulong)i_00 + 1].type != JSMN_PRIMITIVE) goto LAB_00111e1a;
                iVar2 = cgltf_json_to_int(tokens + (ulong)i_00 + 1,json_chunk);
                out_string->mesh = (cgltf_mesh *)((long)iVar2 + 1);
                out_string->mesh_index = iVar2;
              }
              else {
                iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"skin");
                if (iVar2 == 0) {
                  if (tokens[(ulong)i_00 + 1].type != JSMN_PRIMITIVE) goto LAB_00111e1a;
                  iVar2 = cgltf_json_to_int(tokens + (ulong)i_00 + 1,json_chunk);
                  out_string->skin = (cgltf_skin *)((long)iVar2 + 1);
                }
                else {
                  iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"camera");
                  if (iVar2 != 0) {
                    iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"translation");
                    if (iVar2 == 0) {
                      out_string->has_translation = 1;
                      out_array = out_string->translation;
LAB_00111b8a:
                      iVar4 = i_00 + 1;
                      iVar2 = 3;
                    }
                    else {
                      iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"rotation");
                      if (iVar2 == 0) {
                        out_string->has_rotation = 1;
                        iVar4 = i_00 + 1;
                        iVar2 = 4;
                        out_array = out_string->rotation;
                      }
                      else {
                        iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"scale");
                        if (iVar2 == 0) {
                          out_string->has_scale = 1;
                          out_array = out_string->scale;
                          goto LAB_00111b8a;
                        }
                        iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"matrix");
                        if (iVar2 == 0) {
                          out_string->has_matrix = 1;
                          iVar4 = i_00 + 1;
                          iVar2 = 0x10;
                          out_array = out_string->matrix;
                        }
                        else {
                          iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"weights");
                          if (iVar2 != 0) {
                            iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"extras");
                            if (iVar2 == 0) {
                              (out_string->extras).start_offset = (long)tokens[i_00 + 1].start;
                              (out_string->extras).end_offset = (long)tokens[i_00 + 1].end;
                            }
                            else {
                              iVar2 = cgltf_json_strcmp(pjVar7,json_chunk,"extensions");
                              if (iVar2 == 0) {
                                if ((pjVar7[1].type == JSMN_OBJECT) &&
                                   (out_string->extensions == (cgltf_extension *)0x0)) {
                                  iVar2 = pjVar7[1].size;
                                  out_string->extensions_count = 0;
                                  if ((long)iVar2 < 0) {
LAB_00111e33:
                                    out_string->extensions = (cgltf_extension *)0x0;
                                    return -2;
                                  }
                                  cVar8 = (long)iVar2 << 4;
                                  __s = (cgltf_extension *)
                                        (*(options->memory).alloc)
                                                  ((options->memory).user_data,cVar8);
                                  if (__s == (cgltf_extension *)0x0) goto LAB_00111e33;
                                  memset(__s,0,cVar8);
                                  out_string->extensions = __s;
                                  i_00 = i_00 + 2;
                                  if (iVar2 != 0) {
                                    local_ac = 0;
                                    do {
                                      if ((tokens[i_00].type != JSMN_STRING) ||
                                         (pjVar7 = tokens + i_00, pjVar7->size == 0))
                                      goto LAB_00111e1a;
                                      iVar4 = cgltf_json_strcmp(pjVar7,json_chunk,
                                                                "KHR_lights_punctual");
                                      if (iVar4 == 0) {
                                        if (pjVar7[1].type != JSMN_OBJECT) goto LAB_00111e1a;
                                        iVar4 = pjVar7[1].size;
                                        i_00 = i_00 + 2;
                                        if (0 < iVar4) {
                                          do {
                                            if ((tokens[i_00].type != JSMN_STRING) ||
                                               (tokens[i_00].size == 0)) goto LAB_00111e1a;
                                            iVar5 = cgltf_json_strcmp(tokens + i_00,json_chunk,
                                                                      "light");
                                            if (iVar5 == 0) {
                                              if (tokens[(ulong)i_00 + 1].type != JSMN_PRIMITIVE)
                                              goto LAB_00111e1a;
                                              iVar5 = cgltf_json_to_int(tokens + (ulong)i_00 + 1,
                                                                        json_chunk);
                                              out_string->light = (cgltf_light *)((long)iVar5 + 1);
                                              i_00 = i_00 + 2;
                                            }
                                            else {
                                              i_00 = cgltf_skip_json(tokens,i_00 + 1);
                                              if ((int)i_00 < 0) {
                                                return i_00;
                                              }
                                            }
                                            iVar4 = iVar4 + -1;
                                          } while (iVar4 != 0);
                                        }
                                      }
                                      else {
                                        cVar8 = out_string->extensions_count;
                                        out_string->extensions_count = cVar8 + 1;
                                        i_00 = cgltf_parse_json_unprocessed_extension
                                                         (options,tokens,i_00,json_chunk,
                                                          out_string->extensions + cVar8);
                                        if ((int)i_00 < 0) {
                                          return i_00;
                                        }
                                      }
                                      local_ac = local_ac + 1;
                                    } while (local_ac != iVar2);
                                  }
                                  goto LAB_00111b1a;
                                }
                                goto LAB_00111e1a;
                              }
                            }
                            i_00 = cgltf_skip_json(tokens,i_00 + 1);
                            goto LAB_00111a81;
                          }
                          iVar4 = cgltf_parse_json_array
                                            (options,tokens,i_00 + 1,(uint8_t *)0x4,
                                             (size_t)&out_string->weights,
                                             (void **)&out_string->weights_count,
                                             in_stack_ffffffffffffff38);
                          if (iVar4 < 0) {
                            return iVar4;
                          }
                          iVar4 = iVar4 + -1;
                          iVar2 = (int)out_string->weights_count;
                          out_array = out_string->weights;
                        }
                      }
                    }
                    i_00 = cgltf_parse_json_float_array(tokens,iVar4,json_chunk,out_array,iVar2);
                    goto LAB_00111a81;
                  }
                  if (tokens[(ulong)i_00 + 1].type != JSMN_PRIMITIVE) goto LAB_00111e1a;
                  iVar2 = cgltf_json_to_int(tokens + (ulong)i_00 + 1,json_chunk);
                  out_string->camera = (cgltf_camera *)((long)iVar2 + 1);
                }
              }
              i_00 = i_00 + 2;
            }
          }
LAB_00111b1a:
          iVar3 = iVar3 + 1;
        } while (iVar3 != iVar1);
        uVar6 = *out_array_00;
      }
      local_a0 = local_a0 + 1;
      if (uVar6 <= local_a0) {
        return i_00;
      }
    }
LAB_00111e1a:
    i_00 = 0xffffffff;
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_nodes(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_data* out_data)
{
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(cgltf_node), (void**)&out_data->nodes, &out_data->nodes_count);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < out_data->nodes_count; ++j)
	{
		i = cgltf_parse_json_node(options, tokens, i, json_chunk, &out_data->nodes[j]);
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}